

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

void arena_i_decay(tsdn_t *tsdn,uint arena_ind,_Bool all)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  arena_t *paVar6;
  undefined1 ***apppuStack_40 [2];
  
  apppuStack_40[0] = (undefined1 ***)0x11851dc;
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar2 != 0) {
    apppuStack_40[0] = (undefined1 ***)0x11851ec;
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (ctl_mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  if (ctl_arenas->narenas == arena_ind || arena_ind == 0x1000) {
    uVar5 = (ulong)ctl_arenas->narenas;
    lVar1 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
    apppuStack_40[1] = (undefined1 ***)(apppuStack_40 + 1);
    if (uVar5 != 0) {
      uVar3 = 0;
      apppuStack_40[1] = (undefined1 ***)(apppuStack_40 + 1);
      do {
        pvVar4 = duckdb_je_arenas[uVar3].repr;
        if (pvVar4 == (void *)0x0) {
          pvVar4 = (void *)0x0;
        }
        *(void **)((long)apppuStack_40 + uVar3 * 8 + lVar1 + -0x38 + 0x40) = pvVar4;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
    *(undefined8 *)((long)apppuStack_40 + lVar1) = 0x11852d9;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
    if (uVar5 != 0) {
      uVar3 = 0;
      do {
        paVar6 = *(arena_t **)((long)apppuStack_40 + uVar3 * 8 + lVar1 + -0x38 + 0x40);
        if (paVar6 != (arena_t *)0x0) {
          *(undefined8 *)((long)apppuStack_40 + lVar1) = 0x11852fc;
          duckdb_je_arena_decay(tsdn,paVar6,false,all);
        }
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else {
    paVar6 = (arena_t *)duckdb_je_arenas[arena_ind].repr;
    if (paVar6 == (arena_t *)0x0) {
      paVar6 = (arena_t *)0x0;
    }
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
    apppuStack_40[0] = (undefined1 ***)0x11852a2;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
    if (paVar6 != (arena_t *)0x0) {
      duckdb_je_arena_decay(tsdn,paVar6,false,all);
      return;
    }
  }
  return;
}

Assistant:

static void
arena_i_decay(tsdn_t *tsdn, unsigned arena_ind, bool all) {
	malloc_mutex_lock(tsdn, &ctl_mtx);
	{
		unsigned narenas = ctl_arenas->narenas;

		/*
		 * Access via index narenas is deprecated, and scheduled for
		 * removal in 6.0.0.
		 */
		if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind == narenas) {
			unsigned i;
			VARIABLE_ARRAY_UNSAFE(arena_t *, tarenas, narenas);

			for (i = 0; i < narenas; i++) {
				tarenas[i] = arena_get(tsdn, i, false);
			}

			/*
			 * No further need to hold ctl_mtx, since narenas and
			 * tarenas contain everything needed below.
			 */
			malloc_mutex_unlock(tsdn, &ctl_mtx);

			for (i = 0; i < narenas; i++) {
				if (tarenas[i] != NULL) {
					arena_decay(tsdn, tarenas[i], false,
					    all);
				}
			}
		} else {
			arena_t *tarena;

			assert(arena_ind < narenas);

			tarena = arena_get(tsdn, arena_ind, false);

			/* No further need to hold ctl_mtx. */
			malloc_mutex_unlock(tsdn, &ctl_mtx);

			if (tarena != NULL) {
				arena_decay(tsdn, tarena, false, all);
			}
		}
	}
}